

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall OpenMD::SC::calcFunctional(SC *this,SelfData *sdat)

{
  double dVar1;
  double dVar2;
  reference pvVar3;
  reference pvVar4;
  double *pdVar5;
  SC *in_RSI;
  long in_RDI;
  double dVar6;
  pointer piVar7;
  RealType u;
  SCAtomData *data1;
  
  if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
    initialize(in_RSI);
  }
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x60),
                      (long)*(int *)&(in_RSI->super_MetallicInteraction).super_NonBondedInteraction.
                                     _vptr_NonBondedInteraction);
  pvVar4 = std::vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>::operator[]
                     ((vector<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_> *)
                      (in_RDI + 0x78),(long)*pvVar3);
  dVar1 = pvVar4->c;
  dVar2 = pvVar4->epsilon;
  dVar6 = sqrt((double)(in_RSI->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  piVar7 = (pointer)(-dVar1 * dVar2 * dVar6);
  (in_RSI->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = piVar7;
  (in_RSI->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(((double)(in_RSI->SCtids).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start * 0.5) /
                       (double)(in_RSI->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pdVar5 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)&(in_RSI->name_)._M_string_length,3)
  ;
  *pdVar5 = (double)piVar7 + *pdVar5;
  if (((ulong)(in_RSI->SCdata).
              super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
              super__Vector_impl_data._M_finish & 1) != 0) {
    pdVar5 = Vector<double,_7U>::operator[]
                       ((Vector<double,_7U> *)
                        &(in_RSI->SCdata).
                         super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
    *pdVar5 = (double)piVar7 + *pdVar5;
  }
  if (((ulong)(in_RSI->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 1) != 0) {
    (in_RSI->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)
         ((double)piVar7 +
         (double)(in_RSI->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  }
  return;
}

Assistant:

void SC::calcFunctional(SelfData& sdat) {
    if (!initialized_) initialize();

    SCAtomData& data1 = SCdata[SCtids[sdat.atid]];

    RealType u     = -data1.c * data1.epsilon * sqrt(sdat.rho);
    sdat.frho      = u;
    sdat.dfrhodrho = 0.5 * sdat.frho / sdat.rho;

    sdat.selfPot[METALLIC_EMBEDDING_FAMILY] += u;

    if (sdat.isSelected) sdat.selePot[METALLIC_EMBEDDING_FAMILY] += u;

    if (sdat.doParticlePot) { sdat.particlePot += u; }

    return;
  }